

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O0

int strnscmp(char *a,char *b)

{
  ushort **ppuVar1;
  bool bVar2;
  char *local_18;
  char *b_local;
  char *a_local;
  
  b_local = a;
  local_18 = b;
  do {
    while( true ) {
      while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*b_local] & 0x2000) != 0) {
        b_local = b_local + 1;
      }
      while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*local_18] & 0x2000) != 0) {
        local_18 = local_18 + 1;
      }
      while( true ) {
        bVar2 = false;
        if (*b_local != '\0') {
          bVar2 = *b_local == *local_18;
        }
        if (!bVar2) break;
        b_local = b_local + 1;
        local_18 = local_18 + 1;
      }
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)*b_local] & 0x2000) != 0) break;
      ppuVar1 = __ctype_b_loc();
      if ((((*ppuVar1)[(int)*local_18] & 0x2000) == 0) ||
         ((ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)local_18[-1]] & 8) != 0 &&
          (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*b_local] & 8) != 0)))) goto LAB_00115e37;
    }
    ppuVar1 = __ctype_b_loc();
  } while ((((*ppuVar1)[(int)b_local[-1]] & 8) == 0) ||
          (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*local_18] & 8) == 0));
LAB_00115e37:
  return (int)*b_local - (int)*local_18;
}

Assistant:

int strnscmp(const char *a, const char *b)
{
    while(1) {
	while (isspace(*a)) a++;
	while (isspace(*b)) b++;
	while (*a && *a == *b) a++,b++;
	if (isspace(*a)) {
	    if (isalnum(a[-1]) && isalnum(*b))
		break; }
	else if (isspace(*b)) {
	    if (isalnum(b[-1]) && isalnum(*a))
		break; }
	else
	    break; }
    return *a - *b;
}